

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O2

void embree::parseParm(Ref<embree::Stream<embree::Token>_> *cin,
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *parms)

{
  bool bVar1;
  mapped_type *this;
  runtime_error *this_00;
  Token *pTVar2;
  allocator local_f9;
  Token local_f8;
  string local_b0;
  string name;
  Token local_70;
  
  Stream<embree::Token>::get(&local_f8,cin->ptr);
  Token::Identifier_abi_cxx11_(&name,&local_f8);
  Token::~Token(&local_f8);
  Stream<embree::Token>::get(&local_f8,cin->ptr);
  std::__cxx11::string::string((string *)&local_b0,"=",&local_f9);
  Token::Sym(&local_70,&local_b0);
  bVar1 = operator!=(&local_f8,&local_70);
  Token::~Token(&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  Token::~Token(&local_f8);
  if (!bVar1) {
    Stream<embree::Token>::get(&local_f8,cin->ptr);
    Token::String_abi_cxx11_((string *)&local_70,&local_f8);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](parms,&name);
    std::__cxx11::string::operator=((string *)this,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    Token::~Token(&local_f8);
    std::__cxx11::string::~string((string *)&name);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pTVar2 = Stream<embree::Token>::unget(cin->ptr,1);
  ParseLocation::str_abi_cxx11_((string *)&local_70,&pTVar2->loc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                 ": symbol \"=\" expected");
  std::runtime_error::runtime_error(this_00,(string *)&local_f8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parseParm(Ref<Stream<Token> >& cin, std::map<std::string,std::string>& parms)
  {
    std::string name = cin->get().Identifier();
    if (cin->get() != Token::Sym("=")) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \"=\" expected");
    parms[name] = cin->get().String();
  }